

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool slow_bitmap_equals(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t *a1;
  roaring_bitmap_t *r;
  _Bool answer;
  uint32_t *arr2;
  uint32_t *arr1;
  uint64_t card2;
  uint64_t card1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  roaring_bitmap_t *in_stack_ffffffffffffffe0;
  
  uVar2 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffe0);
  uVar3 = roaring_bitmap_get_cardinality(in_stack_ffffffffffffffe0);
  a1 = (uint32_t *)malloc(uVar2 << 2);
  r = (roaring_bitmap_t *)malloc(uVar3 << 2);
  roaring_bitmap_to_uint32_array
            (r,(uint32_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  roaring_bitmap_to_uint32_array
            (r,(uint32_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = array_equals(a1,(int32_t)((ulong)r >> 0x20),
                       (uint32_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
  free(a1);
  free(r);
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool slow_bitmap_equals(roaring_bitmap_t *bitmap1, roaring_bitmap_t *bitmap2) {
    uint64_t card1, card2;
    card1 = roaring_bitmap_get_cardinality(bitmap1);
    card2 = roaring_bitmap_get_cardinality(bitmap2);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(bitmap1, arr1);
    roaring_bitmap_to_uint32_array(bitmap2, arr2);
    bool answer = array_equals(arr1, card1, arr2, card2);
    free(arr1);
    free(arr2);
    return answer;
}